

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall llvm::detail::IEEEFloat::initFromHalfAPInt(IEEEFloat *this,APInt *api)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  Significand SVar4;
  uint uVar5;
  byte bVar6;
  
  if (api->BitWidth != 0x10) {
    __assert_fail("api.getBitWidth()==16",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc7f,"void llvm::detail::IEEEFloat::initFromHalfAPInt(const APInt &)");
  }
  uVar3 = (api->U).VAL;
  uVar2 = uVar3 >> 10;
  uVar5 = (uint)uVar2 & 0x1f;
  this->semantics = (fltSemantics *)semIEEEhalf;
  bVar1 = this->field_0x12;
  bVar6 = (byte)(uVar3 >> 0xc) & 8;
  if ((uVar2 & 0x1f) == 0 && (uVar3 & 0x3ff) == 0) {
    bVar6 = bVar1 & 0xf0 | bVar6 | 3;
  }
  else {
    if (uVar5 != 0x1f || (uVar3 & 0x3ff) != 0) {
      bVar6 = bVar1 & 0xf0 | bVar6;
      if ((uVar3 & 0x3ff) == 0 || uVar5 != 0x1f) {
        uVar3 = (ulong)((uint)uVar3 & 0x3ff);
        this->field_0x12 = bVar6 | 2;
        this->exponent = (short)uVar5 + -0xf;
        (this->significand).part = uVar3;
        if ((uVar2 & 0x1f) == 0) {
          this->exponent = -0xe;
          return;
        }
        SVar4.part = uVar3 | 0x400;
      }
      else {
        this->field_0x12 = bVar6 | 1;
        SVar4._0_4_ = (uint)uVar3 & 0x3ff;
        SVar4.part._4_4_ = 0;
      }
      this->significand = SVar4;
      return;
    }
    bVar6 = bVar1 & 0xf0 | bVar6;
  }
  this->field_0x12 = bVar6;
  return;
}

Assistant:

void IEEEFloat::initFromHalfAPInt(const APInt &api) {
  assert(api.getBitWidth()==16);
  uint32_t i = (uint32_t)*api.getRawData();
  uint32_t myexponent = (i >> 10) & 0x1f;
  uint32_t mysignificand = i & 0x3ff;

  initialize(&semIEEEhalf);
  assert(partCount()==1);

  sign = i >> 15;
  if (myexponent==0 && mysignificand==0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x1f && mysignificand==0) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0x1f && mysignificand!=0) {
    // sign, exponent, significand meaningless
    category = fcNaN;
    *significandParts() = mysignificand;
  } else {
    category = fcNormal;
    exponent = myexponent - 15;  //bias
    *significandParts() = mysignificand;
    if (myexponent==0)    // denormal
      exponent = -14;
    else
      *significandParts() |= 0x400; // integer bit
  }
}